

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O1

void test_cpp_difference_64(void **param_1)

{
  bool bVar1;
  pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map> two_maps;
  Roaring64Map local_e0;
  Roaring64Map local_78;
  
  make_two_big_roaring64_maps();
  doublechecked::Roaring64Map::operator-=(&local_e0,&local_78);
  bVar1 = doublechecked::Roaring64Map::does_std_set_match_roaring(&local_e0);
  _assert_true((ulong)bVar1,"lhs.does_std_set_match_roaring()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x4ed);
  doublechecked::Roaring64Map::~Roaring64Map(&local_78);
  doublechecked::Roaring64Map::~Roaring64Map(&local_e0);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_difference_64) {
    auto two_maps = make_two_big_roaring64_maps();

    auto &lhs = two_maps.first;
    const auto &rhs = two_maps.second;

    lhs -= rhs;
    assert_true(lhs.does_std_set_match_roaring());
}